

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

bool __thiscall QCborStreamReader::leaveContainer(QCborStreamReader *this)

{
  bool bVar1;
  CborError CVar2;
  pointer pQVar3;
  QCborStreamReaderPrivate *in_RDI;
  long in_FS_OFFSET;
  CborError err;
  CborValue container;
  undefined4 in_stack_ffffffffffffff98;
  CborError in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  QCborStreamReaderPrivate *this_00;
  bool local_41;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
  operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_> *
             )0x8d697e);
  bVar1 = QList<CborValue>::isEmpty((QList<CborValue> *)0x8d698a);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    QMessageLogger::warning
              (&local_28,"QCborStreamReader::leaveContainer: trying to leave top-level element");
    local_41 = false;
  }
  else {
    pQVar3 = std::
             unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
             operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                         *)0x8d69ce);
    if ((pQVar3->corrupt & 1U) == 0) {
      std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
      operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                  *)0x8d6a10);
      QStack<CborValue>::pop((QStack<CborValue> *)in_RDI);
      std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
      operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                  *)0x8d6a2f);
      CVar2 = cbor_value_leave_container
                        ((CborValue *)in_RDI,
                         (CborValue *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
      ;
      pQVar3 = std::
               unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
               ::operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                             *)0x8d6a52);
      (pQVar3->currentElement).parser = (CborParser *)&DAT_aaaaaaaaaaaaaaaa;
      (pQVar3->currentElement).source.ptr = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&(pQVar3->currentElement).remaining = &DAT_aaaaaaaaaaaaaaaa;
      if (CVar2 == CborNoError) {
        preparse((QCborStreamReader *)this_00);
        local_41 = true;
      }
      else {
        std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
        operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                    *)0x8d6a82);
        QCborStreamReaderPrivate::handleError(in_RDI,in_stack_ffffffffffffff9c);
        local_41 = false;
      }
    }
    else {
      local_41 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_41;
  }
  __stack_chk_fail();
}

Assistant:

bool QCborStreamReader::leaveContainer()
{
    if (d->containerStack.isEmpty()) {
        qWarning("QCborStreamReader::leaveContainer: trying to leave top-level element");
        return false;
    }
    if (d->corrupt)
        return false;

    CborValue container = d->containerStack.pop();
    CborError err = cbor_value_leave_container(&container, &d->currentElement);
    d->currentElement = container;
    if (err) {
        d->handleError(err);
        return false;
    }

    preparse();
    return true;
}